

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  byte bVar1;
  string_view value_00;
  FieldDescriptor *pFVar2;
  bool bVar3;
  CppType CVar4;
  int number;
  Type TVar5;
  CppStringType CVar6;
  Reflection *pRVar7;
  Descriptor *actual;
  Descriptor *pDVar8;
  ExtensionSet *this_00;
  Cord **ppCVar9;
  Cord *pCVar10;
  char *failure_msg;
  LogMessage *pLVar11;
  uint32_t *puVar12;
  InlinedStringField *this_01;
  MicroString *pMVar13;
  OneofDescriptor *pOVar14;
  ArenaStringPtr *pAVar15;
  Arena *pAVar16;
  uint uVar17;
  uint32_t mask;
  uint32_t *states;
  Voidify local_91;
  uint local_90;
  uint local_8c;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  undefined1 auStack_78 [4];
  uint32_t index;
  char *local_70;
  string_view local_68;
  string local_48;
  string *local_28;
  string *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = value;
  value_local = (string *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pRVar7 = Message::GetReflection(message);
  if (this != pRVar7) {
    pDVar8 = this->descriptor_;
    actual = Message::GetDescriptor((Message *)field_local);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar8,actual,(FieldDescriptor *)value_local,"SetString");
  }
  pDVar8 = FieldDescriptor::containing_type((FieldDescriptor *)value_local);
  if (pDVar8 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"SetString",
               "Field does not match message type.");
  }
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)value_local);
  if (bVar3) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)value_local);
  if (CVar4 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,(FieldDescriptor *)value_local,"SetString",CPPTYPE_STRING);
  }
  bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)value_local);
  if (bVar3) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)value_local);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)value_local);
    std::__cxx11::string::string((string *)&local_48,(string *)value);
    internal::ExtensionSet::SetString
              (this_00,number,(FieldType)TVar5,&local_48,(FieldDescriptor *)value_local);
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  CVar6 = FieldDescriptor::cpp_string_type((FieldDescriptor *)value_local);
  if (CVar6 != kView) {
    if (CVar6 == kCord) {
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)value_local)
      ;
      if (!bVar3) {
        _auStack_78 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
        pCVar10 = MutableField<absl::lts_20250127::Cord>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        absl::lts_20250127::Cord::operator=(pCVar10,_auStack_78);
        return;
      }
      bVar3 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)value_local);
      pFVar2 = field_local;
      if (!bVar3) {
        pOVar14 = FieldDescriptor::containing_oneof((FieldDescriptor *)value_local);
        ClearOneof(this,(Message *)pFVar2,pOVar14);
        pAVar16 = MessageLite::GetArena((MessageLite *)field_local);
        pCVar10 = Arena::Create<absl::lts_20250127::Cord>(pAVar16);
        ppCVar9 = MutableField<absl::lts_20250127::Cord*>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        *ppCVar9 = pCVar10;
      }
      local_68 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
      ppCVar9 = MutableField<absl::lts_20250127::Cord*>
                          (this,(Message *)field_local,(FieldDescriptor *)value_local);
      absl::lts_20250127::Cord::operator=(*ppCVar9,local_68);
      return;
    }
    if (CVar6 != kString) {
      return;
    }
  }
  bVar3 = IsInlined(this,(FieldDescriptor *)value_local);
  if (bVar3) {
    absl_log_internal_check_op_result._4_4_ =
         internal::ReflectionSchema::InlinedStringIndex
                   (&this->schema_,(FieldDescriptor *)value_local);
    local_8c = absl::lts_20250127::log_internal::GetReferenceableValue
                         (absl_log_internal_check_op_result._4_4_);
    local_90 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_88 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                         (&local_8c,&local_90,"index > 0u");
    if (local_88 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_88);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&states,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x810,failure_msg);
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&states);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar11);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&states);
    }
    puVar12 = MutableInlinedStringDonatedArray(this,(Message *)field_local);
    uVar17 = absl_log_internal_check_op_result._4_4_ >> 5;
    bVar1 = (byte)absl_log_internal_check_op_result._4_4_;
    this_01 = MutableField<google::protobuf::internal::InlinedStringField>
                        (this,(Message *)field_local,(FieldDescriptor *)value_local);
    value_00 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
    pAVar16 = MessageLite::GetArena((MessageLite *)field_local);
    bVar3 = IsInlinedStringDonated(this,(Message *)field_local,(FieldDescriptor *)value_local);
    internal::InlinedStringField::Set
              (this_01,value_00,pAVar16,bVar3,puVar12 + uVar17,1 << (bVar1 & 0x1f) ^ 0xffffffff,
               (MessageLite *)field_local);
  }
  else {
    bVar3 = IsMicroString(this,(FieldDescriptor *)value_local);
    if (bVar3) {
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)value_local)
      ;
      if ((bVar3) &&
         (bVar3 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)value_local),
         pFVar2 = field_local, !bVar3)) {
        pOVar14 = FieldDescriptor::containing_oneof((FieldDescriptor *)value_local);
        ClearOneof(this,(Message *)pFVar2,pOVar14);
        pMVar13 = MutableField<google::protobuf::internal::MicroString>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        internal::MicroString::InitDefault(pMVar13);
      }
      pMVar13 = MutableField<google::protobuf::internal::MicroString>
                          (this,(Message *)field_local,(FieldDescriptor *)value_local);
      pAVar16 = MessageLite::GetArena((MessageLite *)field_local);
      internal::MicroString::Set<google::protobuf::Arena*>(pMVar13,value,pAVar16);
    }
    else {
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)value_local)
      ;
      if ((bVar3) &&
         (bVar3 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)value_local),
         pFVar2 = field_local, !bVar3)) {
        pOVar14 = FieldDescriptor::containing_oneof((FieldDescriptor *)value_local);
        ClearOneof(this,(Message *)pFVar2,pOVar14);
        pAVar15 = MutableField<google::protobuf::internal::ArenaStringPtr>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        internal::ArenaStringPtr::InitDefault(pAVar15);
      }
      pAVar15 = MutableField<google::protobuf::internal::ArenaStringPtr>
                          (this,(Message *)field_local,(FieldDescriptor *)value_local);
      pAVar16 = MessageLite::GetArena((MessageLite *)field_local);
      internal::ArenaStringPtr::Set(pAVar15,value,pAVar16);
    }
  }
  return;
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(
        field->number(), field->type(), std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
          break;
        }
        *MutableField<absl::Cord>(message, field) = value;
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          MutableField<InlinedStringField>(message, field)
              ->Set(value, message->GetArena(),
                    IsInlinedStringDonated(*message, field), states, mask,
                    message);
          break;
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          MutableField<MicroString>(message, field)
              ->Set(std::move(value), message->GetArena());
          break;
        }

        // Oneof string fields are never set as a default instance.
        // We just need to pass some arbitrary default string to make it work.
        // This allows us to not have the real default accessible from
        // reflection.
        if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->InitDefault();
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Set(std::move(value), message->GetArena());
        break;
      }
    }
  }
}